

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

LIndex IndexTools::IndividualToJointIndicesArray
                 (LIndex *indices,
                 vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  size_type sVar1;
  LIndex *pLVar2;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RSI;
  long in_RDI;
  Index i;
  LIndex jointI;
  LIndex *step_size;
  size_t vec_size;
  uint local_2c;
  LIndex local_28;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffffe0;
  
  sVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(in_RSI);
  pLVar2 = CalculateStepSize(in_stack_ffffffffffffffe0);
  local_28 = 0;
  for (local_2c = 0; local_2c < sVar1; local_2c = local_2c + 1) {
    local_28 = *(long *)(in_RDI + (ulong)local_2c * 8) * pLVar2[local_2c] + local_28;
  }
  if (pLVar2 != (LIndex *)0x0) {
    operator_delete__(pLVar2);
  }
  return local_28;
}

Assistant:

LIndex IndexTools::IndividualToJointIndicesArray(LIndex* indices,
        const vector<LIndex>& nrElems) 
{
    size_t vec_size = nrElems.size();
    LIndex* step_size=CalculateStepSize(nrElems);

    LIndex jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];

    delete [] step_size;

    return(jointI);
}